

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

int VmIntPow(int power,int number)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (-1 < power) {
    iVar1 = 1;
    if (power != 0) {
      do {
        uVar2 = power & 0xfffffffe;
        iVar3 = 1;
        if ((power & 1U) != 0) {
          iVar3 = number;
        }
        iVar1 = iVar1 * iVar3;
        number = number * number;
        power = (uint)power >> 1;
      } while (1 < uVar2);
    }
    return iVar1;
  }
  if (number != 1) {
    if (number == -1) {
      return -(power & 1U) | 1;
    }
    return 0;
  }
  return 1;
}

Assistant:

int VmIntPow(int power, int number)
{
	if(power < 0)
		return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

	int result = 1;
	while(power)
	{
		if(power & 1)
		{
			result *= number;
			power--;
		}
		number *= number;
		power >>= 1;
	}
	return result;
}